

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  ostream *poVar7;
  int pipe_fd [2];
  Message msg;
  allocator<char> local_125;
  int local_124;
  int local_120;
  int local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_d8,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x450);
    Message::Message((Message *)&local_118);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10),
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10),
               " in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10)," ",1);
    poVar7 = (ostream *)(local_118._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      pcVar6 = "couldn\'t detect the number of threads.";
      lVar5 = 0x26;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_118._M_dataplus._M_p + 0x10));
      poVar7 = (ostream *)(local_118._M_dataplus._M_p + 0x10);
      pcVar6 = " threads.";
      lVar5 = 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10),
               " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10),
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_118._M_dataplus._M_p + 0x10),
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_f8,(stringstream *)local_118._M_dataplus._M_p);
    if ((stringstream *)local_118._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_d8);
  }
  iVar1 = pipe(&local_120);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CHECK failed: File ",(allocator<char> *)&local_124);
    std::operator+(&local_58,&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_38,&local_58,", line ");
    local_b8._M_dataplus._M_p._0_4_ = 0x454;
    StreamableToString<int>(&local_98,(int *)&local_b8);
    std::operator+(&local_d8,&local_38,&local_98);
    std::operator+(&local_118,&local_d8,": ");
    pcVar6 = "pipe(pipe_fd) != -1";
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var2;
      if (_Var2 == 0) {
        do {
          iVar1 = close(local_120);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_11c;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"CHECK failed: File ",&local_125);
        std::operator+(&local_78,&local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_58,&local_78,", line ");
        local_124 = 0x465;
        StreamableToString<int>(&local_b8,&local_124);
        std::operator+(&local_38,&local_58,&local_b8);
        std::operator+(&local_d8,&local_38,": ");
        pcVar6 = "close(pipe_fd[0])";
      }
      else {
        do {
          iVar1 = close(local_11c);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_120;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"CHECK failed: File ",&local_125);
        std::operator+(&local_78,&local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_58,&local_78,", line ");
        local_124 = 0x471;
        StreamableToString<int>(&local_b8,&local_124);
        std::operator+(&local_38,&local_58,&local_b8);
        std::operator+(&local_d8,&local_38,": ");
        pcVar6 = "close(pipe_fd[1])";
      }
      std::operator+(&local_118,&local_d8,pcVar6);
      std::operator+(&local_f8,&local_118," != -1");
      DeathTestAbort(&local_f8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CHECK failed: File ",(allocator<char> *)&local_124);
    std::operator+(&local_58,&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_38,&local_58,", line ");
    local_b8._M_dataplus._M_p._0_4_ = 0x462;
    StreamableToString<int>(&local_98,(int *)&local_b8);
    std::operator+(&local_d8,&local_38,&local_98);
    std::operator+(&local_118,&local_d8,": ");
    pcVar6 = "child_pid != -1";
  }
  std::operator+(&local_f8,&local_118,pcVar6);
  DeathTestAbort(&local_f8);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}